

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple.hpp
# Opt level: O2

void __thiscall burst::dynamic_tuple::swap(dynamic_tuple *this,dynamic_tuple *that)

{
  size_t sVar1;
  char *pcVar2;
  
  sVar1 = this->m_capacity;
  this->m_capacity = that->m_capacity;
  that->m_capacity = sVar1;
  pcVar2 = (this->m_data)._M_t.
           super___uniq_ptr_impl<signed_char,_std::default_delete<signed_char[]>_>._M_t.
           super__Tuple_impl<0UL,_signed_char_*,_std::default_delete<signed_char[]>_>.
           super__Head_base<0UL,_signed_char_*,_false>._M_head_impl;
  (this->m_data)._M_t.super___uniq_ptr_impl<signed_char,_std::default_delete<signed_char[]>_>._M_t.
  super__Tuple_impl<0UL,_signed_char_*,_std::default_delete<signed_char[]>_>.
  super__Head_base<0UL,_signed_char_*,_false>._M_head_impl =
       (that->m_data)._M_t.super___uniq_ptr_impl<signed_char,_std::default_delete<signed_char[]>_>.
       _M_t.super__Tuple_impl<0UL,_signed_char_*,_std::default_delete<signed_char[]>_>.
       super__Head_base<0UL,_signed_char_*,_false>._M_head_impl;
  (that->m_data)._M_t.super___uniq_ptr_impl<signed_char,_std::default_delete<signed_char[]>_>._M_t.
  super__Tuple_impl<0UL,_signed_char_*,_std::default_delete<signed_char[]>_>.
  super__Head_base<0UL,_signed_char_*,_false>._M_head_impl = pcVar2;
  std::
  _Vector_base<burst::management::object_info_t,_std::allocator<burst::management::object_info_t>_>
  ::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&this->m_objects,(_Vector_impl_data *)&that->m_objects);
  sVar1 = this->m_volume;
  this->m_volume = that->m_volume;
  that->m_volume = sVar1;
  return;
}

Assistant:

void swap (dynamic_tuple & that)
        {
            using std::swap;

            swap(this->m_capacity, that.m_capacity);
            swap(this->m_data, that.m_data);
            swap(this->m_objects, that.m_objects);
            swap(this->m_volume, that.m_volume);
        }